

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_TruthPermute_int(int *pMints,int nMints,char *pPerm,int nVars,int *pMintsP)

{
  int local_38;
  int local_34;
  int v;
  int m;
  int *pMintsP_local;
  int nVars_local;
  char *pPerm_local;
  int nMints_local;
  int *pMints_local;
  
  memset(pMintsP,0,(long)nMints << 2);
  for (local_34 = 0; local_34 < nMints; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < nVars; local_38 = local_38 + 1) {
      if ((pMints[local_34] & 1 << ((byte)local_38 & 0x1f)) != 0) {
        pMintsP[local_34] = 1 << (pPerm[local_38] & 0x1fU) | pMintsP[local_34];
      }
    }
  }
  return;
}

Assistant:

void Extra_TruthPermute_int( int * pMints, int nMints, char * pPerm, int nVars, int * pMintsP )
{
    int m, v;
    // clean the storage for minterms
    memset( pMintsP, 0, sizeof(int) * nMints );
    // go through minterms and add the variables
    for ( m = 0; m < nMints; m++ )
        for ( v = 0; v < nVars; v++ )
            if ( pMints[m] & (1 << v) )
                pMintsP[m] |= (1 << pPerm[v]);
}